

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteCollectionCacheRemoveRecord(unqlite_col *pCol,jx9_int64 nId)

{
  unqlite_col_record *puVar1;
  unqlite_col_record *puVar2;
  
  puVar1 = CollectionCacheFetchRecord(pCol,nId);
  if (puVar1 != (unqlite_col_record *)0x0) {
    if (puVar1->pPrevCol == (unqlite_col_record *)0x0) {
      puVar2 = puVar1->pNextCol;
      pCol->apRecord[(uint)nId & pCol->nRecSize - 1] = puVar2;
    }
    else {
      puVar2 = puVar1->pNextCol;
      puVar1->pPrevCol->pNextCol = puVar2;
    }
    if (puVar2 != (unqlite_col_record *)0x0) {
      puVar2->pPrevCol = puVar1->pPrevCol;
    }
    if (pCol->pList == puVar1) {
      pCol->pList = pCol->pList->pNext;
    }
    puVar2 = puVar1->pNext;
    puVar1 = puVar1->pPrev;
    if (puVar1 != (unqlite_col_record *)0x0) {
      puVar1->pNext = puVar2;
    }
    if (puVar2 != (unqlite_col_record *)0x0) {
      puVar2->pPrev = puVar1;
    }
    pCol->nRec = pCol->nRec - 1;
  }
  return (int)puVar1;
}

Assistant:

UNQLITE_PRIVATE int unqliteCollectionCacheRemoveRecord(
	unqlite_col *pCol, /* Target collection */
	jx9_int64 nId      /* Unique record ID */
	)
{
	unqlite_col_record *pRecord;
	/* Fetch the record first */
	pRecord = CollectionCacheFetchRecord(pCol,nId);
	if( pRecord == 0 ){
		/* No such record */
		return UNQLITE_NOTFOUND;
	}
	if( pRecord->pPrevCol ){
		pRecord->pPrevCol->pNextCol = pRecord->pNextCol;
	}else{
		sxu32 iBucket = COL_RECORD_HASH(nId) & (pCol->nRecSize - 1);
		pCol->apRecord[iBucket] = pRecord->pNextCol;
	}
	if( pRecord->pNextCol ){
		pRecord->pNextCol->pPrevCol = pRecord->pPrevCol;
	}
	/* Unlink */
	MACRO_LD_REMOVE(pCol->pList,pRecord);
	pCol->nRec--;
	return UNQLITE_OK;
}